

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

int cmdParse(char *buf,uint32_t *p,uint ext_len,char *ext,cmdCtlParse_t *ctl)

{
  uint32_t *puVar1;
  char cVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  char *pcVar5;
  int iVar6;
  __int32_t **pp_Var7;
  void *pvVar8;
  size_t sVar9;
  char *pcVar10;
  bool bVar11;
  long lVar12;
  int i;
  long lVar13;
  uint32_t uVar14;
  int *piVar15;
  ulong uVar16;
  uint32_t *puVar17;
  int n;
  uint32_t tp1;
  int8_t to3;
  char c;
  int8_t to5;
  int8_t to4;
  uint32_t tp3;
  uint32_t tp2;
  uint32_t tp5;
  uint32_t tp4;
  int pp;
  uint32_t local_80;
  uint32_t local_7c;
  char local_75;
  uint32_t local_74;
  uint32_t *local_70;
  uint *local_68;
  char local_5a;
  char local_59;
  uint32_t *local_58;
  char *local_50;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t local_38;
  int local_34;
  
  local_7c = 0;
  local_40 = 0;
  local_44 = 0;
  local_38 = 0;
  local_3c = 0;
  if (ext_len < 0x800) {
    return -3;
  }
  ctl->opt[0] = '\0';
  ctl->opt[1] = '\0';
  ctl->opt[2] = '\0';
  ctl->opt[3] = '\0';
  lVar13 = 0;
  local_68 = (uint *)ext;
  local_50 = buf;
  __isoc99_sscanf(buf + ctl->eaten," %31s %n",intCmdStr,&local_34);
  ctl->eaten = ctl->eaten + local_34;
  *p = 0xffffffff;
  piVar15 = &cmdInfo[0].vt;
  while (iVar6 = strcasecmp(intCmdStr,*(char **)(piVar15 + -2)), pcVar5 = local_50, iVar6 != 0) {
    lVar13 = lVar13 + 1;
    piVar15 = piVar15 + 6;
    if (lVar13 == 0xa8) {
      return -1;
    }
  }
  *p = ((cmdInfo_t *)(piVar15 + -4))->cmd;
  puVar17 = p + 1;
  p[1] = 0;
  p[2] = 0;
  puVar1 = p + 2;
  p[3] = 0;
  local_70 = puVar1;
  switch(*piVar15) {
  case 0x65:
    break;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x81:
  case 0x82:
    return -2;
  case 0x6f:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    cVar2 = ctl->opt[1];
    goto joined_r0x00125ecc;
  case 0x70:
    lVar12 = (long)ctl->eaten;
    goto LAB_00125f52;
  case 0x71:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    uVar3 = *puVar17;
    goto joined_r0x0012604b;
  case 0x72:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] != '\x01') {
      return -2;
    }
    break;
  case 0x73:
    sVar9 = strlen(local_50 + ctl->eaten);
    p[3] = (uint32_t)sVar9;
    memcpy(local_68,pcVar5 + ctl->eaten,sVar9 & 0xffffffff);
    local_74 = p[3];
    goto LAB_001260b5;
  case 0x74:
    iVar6 = __isoc99_sscanf(local_50 + ctl->eaten," %*s%n %n",&local_80,&local_74);
    if (local_80 == 0 || iVar6 < 0) {
      return -2;
    }
    p[3] = local_80;
    ctl->opt[3] = '\x01';
    memcpy(local_68,local_50 + ctl->eaten,(long)(int)local_80);
LAB_001260b5:
    ctl->eaten = ctl->eaten + local_74;
    break;
  case 0x79:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,puVar1,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar17 < 0) {
      return -2;
    }
    cVar2 = ctl->opt[2];
    goto joined_r0x00125af2;
  case 0x7a:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,local_70,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar17 < 0) {
      return -2;
    }
    goto LAB_00125ec8;
  case 0x7b:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,local_70,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (0x95 < *puVar17) {
      return -2;
    }
LAB_00125ec8:
    cVar2 = ctl->opt[2];
joined_r0x00125ecc:
    if (cVar2 < '\x01') {
      return -2;
    }
    break;
  case 0x7c:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,puVar1,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (0x95 < *puVar17) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    uVar3 = *local_70;
joined_r0x0012604b:
    if (0x95 < uVar3) {
      return -2;
    }
    break;
  case 0x7d:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = __isoc99_sscanf(pcVar5 + lVar12," %c %n",&local_74,&local_80);
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (iVar6 < 1) {
      return -2;
    }
    if ((int)*puVar17 < 0) {
      return -2;
    }
    ctl->eaten = ctl->eaten + local_80;
    pp_Var7 = __ctype_toupper_loc();
    pvVar8 = memchr("RW540123",(*pp_Var7)[(char)local_74],9);
    if (pvVar8 == (void *)0x0) {
      return -2;
    }
    iVar6 = 0x12c8aa;
    goto LAB_00125d18;
  case 0x7e:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = __isoc99_sscanf(pcVar5 + lVar12," %c %n",&local_74,&local_80);
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (iVar6 < 1) {
      return -2;
    }
    if ((int)*puVar17 < 0) {
      return -2;
    }
    ctl->eaten = ctl->eaten + local_80;
    pp_Var7 = __ctype_toupper_loc();
    pvVar8 = memchr("ODU",(*pp_Var7)[(char)local_74],4);
    if (pvVar8 == (void *)0x0) {
      return -2;
    }
    iVar6 = 0x12c8b3;
LAB_00125d18:
    *puVar1 = (int)pvVar8 - iVar6;
    break;
  case 0x7f:
    local_58 = puVar17;
    iVar6 = __isoc99_sscanf(local_50 + ctl->eaten," %*s%n %n",&local_80,&local_74);
    if (local_80 == 0 || iVar6 < 0) {
      return -2;
    }
    p[3] = local_80;
    ctl->opt[2] = '\x01';
    memcpy(local_68,pcVar5 + ctl->eaten,(long)(int)local_80);
    lVar12 = (long)ctl->eaten + (long)(int)local_74;
    ctl->eaten = (int)lVar12;
    puVar17 = local_58;
LAB_00125f52:
    iVar6 = getNum(pcVar5 + lVar12,puVar17,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    uVar14 = *puVar17;
joined_r0x00125fd7:
    if ((int)uVar14 < 0) {
      return -2;
    }
    break;
  case 0x80:
    iVar6 = __isoc99_sscanf(local_50 + ctl->eaten," %*s%n %n",&local_80,&local_74);
    pcVar5 = local_50;
    if (local_80 == 0 || iVar6 < 0) {
      return -2;
    }
    p[1] = local_80;
    memcpy(local_68,local_50 + ctl->eaten,(long)(int)local_80);
    ctl->eaten = ctl->eaten + local_80;
    pcVar10 = (char *)((long)(int)local_80 + (long)local_68);
    *pcVar10 = '\0';
    iVar6 = ctl->eaten;
    sVar9 = strlen(pcVar5 + (long)iVar6 + 1);
    memcpy(pcVar10 + 1,pcVar5 + (long)iVar6 + 1,(long)(int)sVar9);
    iVar6 = (int)sVar9 + 1;
    ctl->eaten = ctl->eaten + iVar6;
    uVar16 = (ulong)(iVar6 + p[1]);
LAB_00125c29:
    p[3] = (uint32_t)uVar16;
    break;
  case 0x83:
    local_58 = puVar17;
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,puVar1,ctl->opt + 2);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,&local_7c,ctl->opt + 3);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*local_58 < 0) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    if ((int)*local_70 < 0) {
      return -2;
    }
    bVar11 = -1 < (int)local_7c && '\0' < ctl->opt[3];
    goto LAB_00125dc6;
  case 0x84:
    local_58 = puVar17;
    iVar6 = __isoc99_sscanf(local_50 + ctl->eaten," %*s%n %n",&local_80,&local_74);
    if (local_80 == 0 || iVar6 < 0) {
      return -2;
    }
    p[3] = local_80;
    ctl->opt[2] = '\x01';
    memcpy(local_68,pcVar5 + ctl->eaten,(long)(int)local_80);
    puVar17 = local_58;
    lVar12 = (long)ctl->eaten + (long)(int)local_74;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,local_58,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,local_70,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar17 < 0) {
      return -2;
    }
    cVar2 = ctl->opt[2];
joined_r0x00125af2:
    if (cVar2 < '\x01') {
      return -2;
    }
    uVar14 = *local_70;
    goto joined_r0x00125fd7;
  case 0x85:
    local_58 = puVar17;
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,puVar1,ctl->opt + 2);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,&local_7c,(int8_t *)&local_80);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*local_58 < 0) {
      return -2;
    }
    bVar11 = (-1 < (int)local_7c && (char)local_80 == '\x01') && '\0' < ctl->opt[2];
LAB_00125dc6:
    if (!bVar11) {
      return -2;
    }
    p[3] = 4;
    *local_68 = local_7c;
    break;
  case 0x86:
    iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,&local_7c,(int8_t *)&local_80);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,&local_40,(int8_t *)&local_74);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,&local_44,&local_75);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,&local_38,&local_59);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar5 + lVar12,&local_3c,&local_5a);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((int)*puVar17 < 0) {
      return -2;
    }
    if ((char)local_80 != '\x01') {
      return -2;
    }
    if ((int)local_7c < 0) {
      return -2;
    }
    if ((char)local_74 != '\x01') {
      return -2;
    }
    if ((int)local_40 < 0) {
      return -2;
    }
    if (local_75 != '\x01') {
      return -2;
    }
    if ((int)local_44 < 0) {
      return -2;
    }
    if (local_59 != '\x01') {
      return -2;
    }
    if ((int)local_38 < 0) {
      return -2;
    }
    if (local_5a != '\x01') {
      return -2;
    }
    p[3] = 0x14;
    *local_68 = local_7c;
    local_68[1] = local_40;
    local_68[2] = local_44;
    local_68[3] = local_38;
    local_68[4] = local_3c;
    break;
  default:
    switch(*piVar15) {
    case 0xbf:
      iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
      ctl->eaten = ctl->eaten + iVar6;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((int)*puVar17 < 0) {
        return -2;
      }
      lVar12 = 0;
      do {
        iVar6 = getNum(local_50 + ctl->eaten,&local_7c,(int8_t *)&local_80);
        ctl->eaten = ctl->eaten + iVar6;
        if ((char)local_80 != '\x01') goto LAB_00125842;
        local_68[lVar12] = local_7c;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 10);
      lVar12 = 10;
LAB_00125842:
      p[3] = (int)lVar12 << 2;
      break;
    case 0xc0:
      uVar16 = 0;
      lVar12 = 0;
      while( true ) {
        iVar6 = getNum(local_50 + ctl->eaten,&local_7c,(int8_t *)&local_80);
        ctl->eaten = ctl->eaten + iVar6;
        if ((char)local_80 != '\x01') break;
        *(uint32_t *)((long)local_68 + lVar12) = local_7c;
        lVar12 = lVar12 + 4;
        uVar16 = uVar16 + 1;
        if ((int)lVar12 == 0x800) {
          p[3] = 0x800;
          return -2;
        }
      }
      uVar14 = (uint32_t)lVar12;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar16;
      p[3] = uVar14;
      if ((SUB164(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffcU) * 3 != uVar14 ||
          uVar14 == 0) {
        return -2;
      }
      break;
    case 0xc1:
      iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
      iVar6 = iVar6 + ctl->eaten;
      ctl->eaten = iVar6;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((int)*puVar17 < 0) {
        return -2;
      }
      lVar12 = 0;
      do {
        iVar6 = getNum(local_50 + iVar6,&local_7c,(int8_t *)&local_80);
        if (((char)local_80 != '\x01') || (0xff < local_7c)) {
          p[3] = (uint32_t)lVar12;
          if (((uint32_t)lVar12 == 0) && (*p != 0x72)) {
            return -2;
          }
          goto switchD_0012578b_caseD_65;
        }
        *(char *)((long)local_68 + lVar12) = (char)local_7c;
        iVar6 = iVar6 + ctl->eaten;
        ctl->eaten = iVar6;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x200);
      goto LAB_001264e6;
    case 0xc2:
      local_58 = puVar17;
      iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar5 + lVar12,puVar1,ctl->opt + 2);
      iVar6 = iVar6 + ctl->eaten;
      ctl->eaten = iVar6;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if (ctl->opt[2] != '\x01') {
        return -2;
      }
      if ((int)*local_58 < 0) {
        return -2;
      }
      if (0xff < *local_70) {
        return -2;
      }
      lVar12 = 0;
      do {
        iVar6 = getNum(local_50 + iVar6,&local_7c,(int8_t *)&local_80);
        if (((char)local_80 != '\x01') || (0xff < local_7c)) goto LAB_001264f0;
        *(char *)((long)local_68 + lVar12) = (char)local_7c;
        iVar6 = iVar6 + ctl->eaten;
        ctl->eaten = iVar6;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x20);
      p[3] = 0x20;
      break;
    case 0xc3:
      iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
      puVar1 = local_70;
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      if (ctl->opt[1] != '\x01') break;
      if ((int)*puVar17 < 0) {
        return -2;
      }
      iVar6 = getNum(pcVar5 + lVar12,local_70,ctl->opt + 2);
      iVar6 = iVar6 + ctl->eaten;
      ctl->eaten = iVar6;
      if (ctl->opt[2] != '\x01') break;
      if ((int)*puVar1 < 0) {
        return -2;
      }
      uVar16 = 0;
      do {
        iVar6 = getNum(local_50 + iVar6,&local_7c,(int8_t *)&local_80);
        if (((char)local_80 != '\x01') || (0xff < local_7c)) goto LAB_00125c29;
        *(char *)((long)local_68 + uVar16) = (char)local_7c;
        uVar16 = uVar16 + 1;
        iVar6 = iVar6 + ctl->eaten;
        ctl->eaten = iVar6;
      } while ((int)uVar16 != 0x200);
      uVar16 = 0x200;
      goto LAB_00125c29;
    case 0xc4:
      local_58 = puVar17;
      iVar6 = getNum(local_50 + ctl->eaten,puVar17,ctl->opt + 1);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar5 + lVar12,puVar1,ctl->opt + 2);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar5 + lVar12,&local_7c,(int8_t *)&local_80);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar5 + lVar12,&local_40,(int8_t *)&local_74);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar5 + lVar12,&local_44,&local_75);
      ctl->eaten = ctl->eaten + iVar6;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((int)*local_58 < 0) {
        return -2;
      }
      if (ctl->opt[2] != '\x01') {
        return -2;
      }
      if ((int)*local_70 < 1) {
        return -2;
      }
      if ((char)local_80 != '\x01') {
        return -2;
      }
      if ((char)local_74 != '\x01') {
        return -2;
      }
      if (local_75 != '\x01') {
        return -2;
      }
      *local_68 = local_7c;
      local_68[1] = local_40;
      local_68[2] = local_44;
      iVar6 = ctl->eaten;
      lVar12 = 0;
      do {
        iVar6 = getNum(local_50 + iVar6,&local_7c,(int8_t *)&local_80);
        if (((char)local_80 != '\x01') || (0xff < local_7c)) {
          p[3] = (int)lVar12 + 0xc;
          goto LAB_001264f4;
        }
        *(char *)((long)local_68 + lVar12 + 0xc) = (char)local_7c;
        iVar6 = iVar6 + ctl->eaten;
        ctl->eaten = iVar6;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x200);
      p[3] = 0x20c;
      break;
    case 0xc5:
      iVar6 = ctl->eaten;
      lVar12 = 0;
      do {
        iVar6 = getNum(local_50 + iVar6,&local_7c,(int8_t *)&local_80);
        if (((char)local_80 != '\x01') || (0xff < local_7c)) goto LAB_001264f0;
        *(char *)((long)local_68 + lVar12) = (char)local_7c;
        iVar6 = iVar6 + ctl->eaten;
        ctl->eaten = iVar6;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x200);
LAB_001264e6:
      p[3] = 0x200;
      break;
    default:
      return -2;
    }
  }
switchD_0012578b_caseD_65:
  return (int)lVar13;
LAB_001264f0:
  p[3] = (uint32_t)lVar12;
LAB_001264f4:
  if ((int)lVar12 == 0) {
    return -2;
  }
  goto switchD_0012578b_caseD_65;
}

Assistant:

int cmdParse(
   char *buf, uint32_t *p, unsigned ext_len, char *ext, cmdCtlParse_t *ctl)
{
   int f, valid, idx, val, pp, pars, n, n2;
   char *p8;
   int32_t *p32;
   char c;
   uint32_t tp1=0, tp2=0, tp3=0, tp4=0, tp5=0;
   int8_t to1, to2, to3, to4, to5;
   int eaten;

   /* Check that ext is big enough for the largest message. */
   if (ext_len < (4 * CMD_MAX_PARAM)) return CMD_EXT_TOO_SMALL;

   bzero(&ctl->opt, sizeof(ctl->opt));

   sscanf(buf+ctl->eaten, " %31s %n", intCmdStr, &pp);

   ctl->eaten += pp;

   p[0] = -1;

   idx = cmdMatch(intCmdStr);

   if (idx < 0) return idx;

   valid = 0;

   p[0] = cmdInfo[idx].cmd;
   p[1] = 0;
   p[2] = 0;
   p[3] = 0;

   switch (cmdInfo[idx].vt)
   {
      case 101: /* BR1  BR2  CGI  H  HELP  HWVER
                   DCRA  HALT  INRA  NO
                   PIGPV  POPA  PUSHA  RET  T  TICK  WVBSY  WVCLR
                   WVCRE  WVGO  WVGOR  WVHLT  WVNEW

                   No parameters, always valid.
                */
         valid = 1;

         break;

      case 111: /* ADD  AND  BC1  BC2  BS1  BS2  
                   CMP  CSI  DIV  LDA  LDAB  MLT
                   MOD  OR  RLA  RRA  STAB  SUB  WAIT  XOR

                   One parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] > 0) valid = 1;

         break;

      case 112: /* BI2CC FC  GDC  GPW  I2CC  I2CRB
                   MG  MICS  MILS  MODEG  NC  NP  PADG PFG  PRG
                   PROCD  PROCP  PROCS  PRRG  R  READ  SLRC  SPIC
                   WVDEL  WVSC  WVSM  WVSP  WVTX  WVTXR  BSPIC

                   One positive parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)) valid = 1;

         break;

      case 113: /* DCR  INR  POP  PUSH  STA  XA

                   One register parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 114: /* CALL  JM  JMP  JNZ  JP  JZ  TAG

                   One numeric parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         if (ctl->opt[1] == CMD_NUMERIC) valid = 1;

         break;

      case 115: /* PARSE  PROC

                   One parameter, string (rest of input).
                */
         p[3] = strlen(buf+ctl->eaten);
         memcpy(ext, buf+ctl->eaten, p[3]);
         ctl->eaten += p[3];
         valid = 1;

         break;

      case 116: /* SYS

                   One parameter, a string.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[3] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;
            valid = 1;
         }

         break;

      case 121: /* HC  FR  I2CRD  I2CRR  I2CRW  I2CWB I2CWQ  P
                   PADS  PFS  PRS  PWM  S  SERVO  SLR  SLRI  W
                   WDOG  WRITE  WVTXM

                   Two positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0)) valid = 1;

         break;

      case 122: /* NB

                   Two parameters, first positive, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 123: /* LD  RL  RR

                   Two parameters, first register, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) &&
             (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 124: /* X

                   Two register parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0) && (p[2] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 125: /* M MODES

                   Two parameters, first positive, second in 'RW540123'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtMdeStr, val);

            if (p8 != NULL)
            {
               val = p8 - fmtMdeStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 126: /* PUD

                   Two parameters, first positive, second in 'ODU'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)  && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtPudStr, val);
            if (p8 != NULL)
            {
               val = p8 - fmtPudStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 127: /* FL  FO

                   Two parameters, first a string, other positive.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0))
               valid = 1;
         }

         break;

      case 128: /* SHELL

                   Two string parameters, the first space teminated.
                   The second arbitrary.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);

         if ((f >= 0) && n)
         {
            valid = 1;

            p[1] = n;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n;
            ext[n] = 0; /* terminate first string */

            n2 = strlen(buf+ctl->eaten+1);
            memcpy(ext+n+1, buf+ctl->eaten+1, n2);
            ctl->eaten += n2;
            ctl->eaten ++;
            p[3] = p[1] + n2 + 1;
         }

         break;

      case 131: /* BI2CO  HP  I2CO  I2CPC  I2CRI  I2CWB  I2CWW
                   SLRO  SPIO  TRIG

                   Three positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &ctl->opt[3]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0) &&
             (ctl->opt[3] > 0) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 132: /* SERO

                   Three parameters, first a string, rest >=0
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
            ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
                (ctl->opt[2] > 0) && ((int)p[2] >= 0))
               valid = 1;
         }

         break;

      case 133: /* FS

                   Three parameters.  First and third positive.
                   Second may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 134: /* BSPIO

                   Six parameters.  First to Fifth positive.
                   Sixth may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);
         ctl->eaten += getNum(buf+ctl->eaten, &tp4, &to4);
         ctl->eaten += getNum(buf+ctl->eaten, &tp5, &to5);
                                    
         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0) &&
             (to2 == CMD_NUMERIC) && ((int)tp2 >= 0) &&
             (to3 == CMD_NUMERIC) && ((int)tp3 >= 0) &&
             (to4 == CMD_NUMERIC) && ((int)tp4 >= 0) &&
             (to5 == CMD_NUMERIC))
         {
            p[3] = 5 * 4;
            memcpy(ext+ 0, &tp1, 4);
            memcpy(ext+ 4, &tp2, 4);
            memcpy(ext+ 8, &tp3, 4);
            memcpy(ext+12, &tp4, 4);
            memcpy(ext+16, &tp5, 4);
            valid = 1;
         }

         break;

      case 191: /* PROCR PROCU

                   One to 11 parameters, first positive,
                   optional remainder, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p32 = (int32_t *)ext;

            while (pars < PI_MAX_SCRIPT_PARAMS)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  pars++;
                  *p32++ = tp1;
               }
               else break;
            }

            p[3] = pars * 4;

            valid = 1;
         }

         break;

      case 192: /* WVAG

                   One or more triplets (gpios on, gpios off, delay),
                   any value.
                */

         pars = 0;
         p32 = (int32_t *)ext;

         while (pars < CMD_MAX_PARAM)
         {
            ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               pars++;
               *p32++ = tp1;
            }
            else break;
         }

         p[3] = pars * 4;

         if (pars && ((pars % 3) == 0)) valid = 1;

         break;

      case 193: /* BI2CZ  BSCX  BSPIX  FW  I2CWD  I2CZ  SERW
		   SPIW  SPIX

                   Two or more parameters, first >=0, rest 0-255.

		   BSCX is special case one or more.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p8 = ext;

            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars || (p[0]==PI_CMD_BSCX)) valid = 1;
         }

         break;

      case 194: /* I2CPK  I2CWI  I2CWK

                   Three to 34 parameters, all 0-255.
                */

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] == CMD_NUMERIC) &&
             (ctl->opt[2] == CMD_NUMERIC) &&
             ((int)p[1]>=0) && ((int)p[2]>=0) && ((int)p[2]<=255))
         {
            pars = 0;
            p8 = ext;

            while (pars < 32)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars > 0) valid = 1;
         }

         break;

      case 195: /* CF1  CF2

                   Zero or more parameters, first two >=0, rest 0-255.
                */
         valid = 1;

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] == CMD_NUMERIC)
         {
            if ((int)p[1] >= 0)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

               if (ctl->opt[2] == CMD_NUMERIC)
               {
                  if ((int)p[2] >= 0)
                  {
                     pars = 0;
                     p8 = ext;

                     while (pars < CMD_MAX_PARAM)
                     {
                        eaten = getNum(buf+ctl->eaten, &tp1, &to1);
                        if (to1 == CMD_NUMERIC)
                        {
                           if (((int)tp1>=0) && ((int)tp1<=255))
                           {
                              pars++;
                              *p8++ = tp1;
                              ctl->eaten += eaten;
                           }
                           else break;
                        }
                        else break;
                     }

                     p[3] = pars;
                  }
                  else valid = 0;
               }
            }
            else valid = 0;
         }

         break;

      case 196: /* WVAS

                   gpio baud offset char...

                   p1 gpio
                   p2 baud
                   p3 len + 4
                   ---------
                   uint32_t databits
                   uint32_t stophalfbits
                   uint32_t offset
                   uint8_t[len]
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0) &&
             (ctl->opt[2] == CMD_NUMERIC) && ((int)p[2] > 0) &&
             (to1 == CMD_NUMERIC) &&
             (to2 == CMD_NUMERIC) &&
             (to3 == CMD_NUMERIC))
         {
            pars = 0;

            memcpy(ext, &tp1, 4);
            memcpy(ext+4, &tp2, 4);
            memcpy(ext+8, &tp3, 4);
            p8 = ext + 12;
            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     *p8++ = tp1;
                     pars++;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars + 12;

            if (pars > 0) valid = 1;
         }

         break;

      case 197: /* WVCHA

                   One or more parameters, all 0-255.
                */
         pars = 0;
         p8 = ext;

         while (pars < CMD_MAX_PARAM)
         {
            eaten = getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               if (((int)tp1>=0) && ((int)tp1<=255))
               {
                  pars++;
                  *p8++ = tp1;
                  ctl->eaten += eaten;
               }
               else break; /* invalid number, end of command */
            }
            else break;
         }

         p[3] = pars;

         if (pars) valid = 1;

         break;


   }

   if (valid) return idx; else return CMD_BAD_PARAMETER;
}